

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QJsonArray convertToJsonArray(QCborContainerPrivate *d,ConversionMode mode)

{
  ConversionMode in_EDX;
  undefined4 in_register_00000034;
  QCborContainerPrivate *d_00;
  ulong idx;
  long in_FS_OFFSET;
  QJsonValue QStack_48;
  long local_30;
  
  d_00 = (QCborContainerPrivate *)CONCAT44(in_register_00000034,mode);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)d = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)d);
  if (d_00 != (QCborContainerPrivate *)0x0) {
    for (idx = 0; idx < (ulong)(d_00->elements).d.size; idx = idx + 1) {
      qt_convertToJson(&QStack_48,d_00,idx,in_EDX);
      QJsonArray::append((QJsonArray *)d,&QStack_48);
      QJsonValue::~QJsonValue(&QStack_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)d;
  }
  __stack_chk_fail();
}

Assistant:

static QJsonArray convertToJsonArray(QCborContainerPrivate *d,
                                     ConversionMode mode = ConversionMode::FromRaw)
{
    QJsonArray a;
    if (d) {
        for (qsizetype idx = 0; idx < d->elements.size(); ++idx)
            a.append(qt_convertToJson(d, idx, mode));
    }
    return a;
}